

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O3

optional<int> obj::read_index(char **ptr)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char *local_30;
  
  pcVar4 = *ptr + -1;
  do {
    cVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
    iVar2 = isspace((int)cVar1);
  } while (iVar2 != 0);
  if (cVar1 != '-' && 9 < (int)cVar1 - 0x30U) {
    return (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  }
  local_30 = pcVar4;
  uVar3 = strtol(pcVar4,&local_30,10);
  pcVar4 = local_30;
  do {
    cVar1 = *pcVar4;
    iVar2 = isspace((int)cVar1);
    pcVar4 = pcVar4 + 1;
  } while (iVar2 != 0);
  if (cVar1 == '/') {
    local_30 = pcVar4;
    if (*pcVar4 != '/') {
      strtol(pcVar4,&local_30,10);
      pcVar4 = local_30;
    }
    do {
      cVar1 = *pcVar4;
      iVar2 = isspace((int)cVar1);
      pcVar4 = pcVar4 + 1;
    } while (iVar2 != 0);
    if (cVar1 == '/') {
      local_30 = pcVar4;
      strtol(pcVar4,&local_30,10);
      goto LAB_00116711;
    }
  }
  local_30 = pcVar4 + -1;
LAB_00116711:
  *ptr = local_30;
  return (_Optional_base<int,_true,_true>)
         (_Optional_base<int,_true,_true>)(uVar3 & 0xffffffff | 0x100000000);
}

Assistant:

inline std::optional<int> read_index(char** ptr) {
    char* base = *ptr;

    // Detect end of line (negative indices are supported) 
    base = strip_spaces(base);
    if (!std::isdigit(*base) && *base != '-')
        return std::nullopt;

    int index = std::strtol(base, &base, 10);
    base = strip_spaces(base);

    if (*base == '/') {
        base++;

        // Handle the case when there is no texture coordinate
        if (*base != '/')
            std::strtol(base, &base, 10);

        base = strip_spaces(base);

        if (*base == '/') {
            base++;
            std::strtol(base, &base, 10);
        }
    }

    *ptr = base;
    return std::make_optional(index);
}